

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.cpp
# Opt level: O3

string * __thiscall
vkt::sparse::getImageComponentVec4TypeName_abi_cxx11_
          (string *__return_storage_ptr__,sparse *this,TextureFormat *format)

{
  TextureChannelClass TVar1;
  char *pcVar2;
  char *pcVar3;
  
  TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    pcVar3 = "%type_ivec4";
    pcVar2 = "";
  }
  else if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar3 = "%type_uvec4";
    pcVar2 = "";
  }
  else {
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getImageComponentVec4TypeName (const tcu::TextureFormat& format)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return "%type_uvec4";
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return "%type_ivec4";
		default:
			DE_ASSERT(0);
			return "";
	}
}